

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5TriTokenize(Fts5Tokenizer *pTok,void *pCtx,int unusedFlags,char *pText,int nText,
                   _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  byte *pbVar12;
  long in_FS_OFFSET;
  uint *local_88;
  int local_68 [4];
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar12 = (byte *)(pText + nText);
  if (pText == (char *)0x0) {
    pbVar12 = (byte *)pText;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68[0] = -0x55555556;
  local_68[1] = -0x55555556;
  local_68[2] = -0x55555556;
  local_88 = (uint *)&local_58;
  pbVar10 = (byte *)pText;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    do {
      local_68[lVar6] = (int)pbVar10 - (int)pText;
      if (pbVar12 <= pbVar10) {
        iVar3 = 0;
        goto LAB_001d5bc0;
      }
      bVar1 = *pbVar10;
      uVar2 = (uint)bVar1;
      pbVar8 = pbVar10 + 1;
      pbVar10 = pbVar8;
      if (0xbf < bVar1) {
        uVar5 = (uint)""[bVar1 - 0xc0];
        for (; (pbVar10 = pbVar12, pbVar8 < pbVar12 &&
               (pbVar10 = pbVar8, (*pbVar8 & 0xffffffc0) == 0x80)); pbVar8 = pbVar8 + 1) {
          uVar5 = uVar5 << 6 | *pbVar8 & 0x3f;
        }
        uVar2 = uVar5;
        if ((uVar5 & 0xfffff800) == 0xd800) {
          uVar2 = 0xfffd;
        }
        if (uVar5 < 0x80) {
          uVar2 = 0xfffd;
        }
        if ((uVar5 & 0xfffffffe) == 0xfffe) {
          uVar2 = 0xfffd;
        }
      }
      if (*(int *)pTok != 0) {
        uVar2 = sqlite3Fts5UnicodeFold(uVar2,*(int *)(pTok + 4));
      }
    } while (uVar2 == 0);
    bVar1 = (byte)uVar2;
    if (uVar2 < 0x80) {
      *(byte *)local_88 = bVar1;
      local_88 = (uint *)((long)local_88 + 1);
    }
    else if (uVar2 < 0x800) {
      *(byte *)local_88 = (byte)(uVar2 >> 6) | 0xc0;
      *(byte *)((long)local_88 + 1) = bVar1 & 0x3f | 0x80;
      local_88 = (uint *)((long)local_88 + 2);
    }
    else if (uVar2 < 0x10000) {
      *(byte *)local_88 = (byte)(uVar2 >> 0xc) | 0xe0;
      *(byte *)((long)local_88 + 1) = (byte)(uVar2 >> 6) & 0x3f | 0x80;
      *(byte *)((long)local_88 + 2) = bVar1 & 0x3f | 0x80;
      local_88 = (uint *)((long)local_88 + 3);
    }
    else {
      *local_88 = (uVar2 << 0x18 |
                  (uVar2 & 0x3fc0) << 10 | uVar2 >> 0x12 & 0xff | uVar2 >> 4 & 0xff00) &
                  (uint)DAT_001eae90 | (uint)DAT_001eaea0;
      local_88 = local_88 + 1;
    }
  }
LAB_001d5be8:
  pbVar8 = pbVar10;
  if (pbVar8 < pbVar12) goto code_r0x001d5bf4;
  uVar7 = 0;
  pbVar10 = pbVar8;
  goto LAB_001d5c8d;
code_r0x001d5bf4:
  pbVar9 = pbVar8 + 1;
  bVar1 = *pbVar8;
  uVar7 = (ulong)bVar1;
  pbVar10 = pbVar9;
  if (0xbf < bVar1) {
    uVar2 = (uint)""[bVar1 - 0xc0];
    for (; (pbVar10 = pbVar12, pbVar9 < pbVar12 &&
           (pbVar10 = pbVar9, (*pbVar9 & 0xffffffc0) == 0x80)); pbVar9 = pbVar9 + 1) {
      uVar2 = uVar2 << 6 | *pbVar9 & 0x3f;
    }
    uVar7 = (ulong)uVar2;
    if ((uVar2 & 0xfffff800) == 0xd800) {
      uVar7 = 0xfffd;
    }
    if (uVar2 < 0x80) {
      uVar7 = 0xfffd;
    }
    if ((uVar2 & 0xfffffffe) == 0xfffe) {
      uVar7 = 0xfffd;
    }
  }
  if (*(int *)pTok != 0) {
    uVar2 = sqlite3Fts5UnicodeFold((int)uVar7,*(int *)(pTok + 4));
    uVar7 = (ulong)uVar2;
  }
  if ((int)uVar7 != 0) {
LAB_001d5c8d:
    iVar11 = (int)pbVar8 - (int)pText;
    iVar3 = (*xToken)(pCtx,0,(char *)&local_58,(int)local_88 - (int)&local_58,local_68[0],iVar11);
    uVar2 = (uint)uVar7;
    if ((uVar2 == 0) || (iVar3 != 0)) {
LAB_001d5bc0:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return iVar3;
    }
    lVar6 = (long)&local_58 + 1;
    __memmove_chk(&local_58,lVar6,(long)local_88 - lVar6,0x20);
    puVar4 = (uint *)(((long)&local_58 - lVar6) + (long)local_88);
    bVar1 = (byte)uVar7;
    if (uVar2 < 0x80) {
      *(byte *)puVar4 = bVar1;
      local_88 = (uint *)((long)puVar4 + 1);
    }
    else if (uVar2 < 0x800) {
      *(byte *)puVar4 = (byte)(uVar7 >> 6) | 0xc0;
      *(byte *)((long)puVar4 + 1) = bVar1 & 0x3f | 0x80;
      local_88 = (uint *)((long)puVar4 + 2);
    }
    else if (uVar2 < 0x10000) {
      *(byte *)puVar4 = (byte)(uVar2 >> 0xc) | 0xe0;
      *(byte *)((long)puVar4 + 1) = (byte)(uVar7 >> 6) & 0x3f | 0x80;
      *(byte *)((long)puVar4 + 2) = bVar1 & 0x3f | 0x80;
      local_88 = (uint *)((long)puVar4 + 3);
    }
    else {
      local_88 = puVar4 + 1;
      *puVar4 = (uVar2 << 0x18 |
                (uVar2 & 0x3fc0) << 10 | uVar2 >> 0x12 & 0xff | (uint)(uVar7 >> 4) & 0xff00) &
                (uint)DAT_001eae90 | (uint)DAT_001eaea0;
    }
    local_68[0] = local_68[1];
    local_68[1] = local_68[2];
    local_68[2] = iVar11;
  }
  goto LAB_001d5be8;
}

Assistant:

static int fts5TriTokenize(
  Fts5Tokenizer *pTok,
  void *pCtx,
  int unusedFlags,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int, int, int)
){
  TrigramTokenizer *p = (TrigramTokenizer*)pTok;
  int rc = SQLITE_OK;
  char aBuf[32];
  char *zOut = aBuf;
  int ii;
  const unsigned char *zIn = (const unsigned char*)pText;
  const unsigned char *zEof = (zIn ? &zIn[nText] : 0);
  u32 iCode = 0;
  int aStart[3];                  /* Input offset of each character in aBuf[] */

  UNUSED_PARAM(unusedFlags);

  /* Populate aBuf[] with the characters for the first trigram. */
  for(ii=0; ii<3; ii++){
    do {
      aStart[ii] = zIn - (const unsigned char*)pText;
      if( zIn>=zEof ) return SQLITE_OK;
      READ_UTF8(zIn, zEof, iCode);
      if( p->bFold ) iCode = sqlite3Fts5UnicodeFold(iCode, p->iFoldParam);
    }while( iCode==0 );
    WRITE_UTF8(zOut, iCode);
  }

  /* At the start of each iteration of this loop:
  **
  **  aBuf:      Contains 3 characters. The 3 characters of the next trigram.
  **  zOut:      Points to the byte following the last character in aBuf.
  **  aStart[3]: Contains the byte offset in the input text corresponding
  **             to the start of each of the three characters in the buffer.
  */
  assert( zIn<=zEof );
  while( 1 ){
    int iNext;                    /* Start of character following current tri */
    const char *z1;

    /* Read characters from the input up until the first non-diacritic */
    do {
      iNext = zIn - (const unsigned char*)pText;
      if( zIn>=zEof ){
        iCode = 0;
        break;
      }
      READ_UTF8(zIn, zEof, iCode);
      if( p->bFold ) iCode = sqlite3Fts5UnicodeFold(iCode, p->iFoldParam);
    }while( iCode==0 );

    /* Pass the current trigram back to fts5 */
    rc = xToken(pCtx, 0, aBuf, zOut-aBuf, aStart[0], iNext);
    if( iCode==0 || rc!=SQLITE_OK ) break;

    /* Remove the first character from buffer aBuf[]. Append the character
    ** with codepoint iCode.  */
    z1 = aBuf;
    FTS5_SKIP_UTF8(z1);
    memmove(aBuf, z1, zOut - z1);
    zOut -= (z1 - aBuf);
    WRITE_UTF8(zOut, iCode);

    /* Update the aStart[] array */
    aStart[0] = aStart[1];
    aStart[1] = aStart[2];
    aStart[2] = iNext;
  }

  return rc;
}